

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

Am_Wrapper * examples_of_selected_class_proc(Am_Object *self)

{
  char cVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_String class_name;
  Am_Object cls;
  Am_Object curr_example;
  Am_Value_List l;
  Am_String local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value_List local_18 [16];
  
  Am_Value_List::Am_Value_List(local_18);
  pAVar2 = (Am_Value *)Am_Object::Get(0x510,0x169);
  Am_Object::Am_Object(&local_30,pAVar2);
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_30,(ulong)(ushort)CLASS_EXAMPLES);
    Am_Value_List::operator=(local_18,pAVar2);
  }
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)self,0x169);
  Am_Object::Am_Object(&local_28,pAVar2);
  Am_Value_List::Start();
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
    cVar1 = Am_Value_List::Member((Am_Wrapper *)local_18);
    if (cVar1 != '\0') goto LAB_00109596;
  }
  Am_Object::Set((ushort)self,0x169,0);
LAB_00109596:
  local_38.data = (Am_String_Data *)0x0;
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    Am_String::operator=(&local_38,"");
  }
  else {
    pAVar2 = (Am_Value *)Am_Object::Get((ushort)&local_30,(ulong)(ushort)CLASS_NAME);
    Am_String::operator=(&local_38,pAVar2);
  }
  Am_Object::Set(0x518,(Am_String *)0x169,(ulong)&local_38);
  Am_Object::Get_Object((ushort)&local_20,0x110518);
  Am_Object::Set((ushort)&local_20,(Am_String *)0x169,(ulong)&local_38);
  Am_Object::~Am_Object(&local_20);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_18);
  Am_String::~Am_String(&local_38);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List(local_18);
  return pAVar3;
}

Assistant:

Am_Define_Value_List_Formula(examples_of_selected_class)
{
  // fetch current class's examples
  Am_Value_List l;
  Am_Object cls = class_panel.Get(Am_VALUE);

  if (cls.Valid())
    l = cls.Get(CLASS_EXAMPLES);

  // if currently-selected example is no longer in the list, unselect it
  Am_Object curr_example = self.Get(Am_VALUE);
  l.Start();
  if (!curr_example.Valid() || !l.Member(curr_example))
    self.Set(Am_VALUE, 0);

  // incidentally set the name into current_class_name widget
  Am_String class_name;
  if (cls.Valid())
    class_name = cls.Get(CLASS_NAME);
  else
    class_name = "";
  current_class_name.Set(Am_VALUE, class_name);
  current_class_name.Get_Object(Am_COMMAND).Set(Am_VALUE, class_name);

  return l;
}